

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::LogFail
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter,
          GLuint *data,GLuint *reference,GLsizei count)

{
  Bitfield<16UL> decoder;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 in_register_00000014;
  long lVar1;
  undefined4 in_register_0000008c;
  int in_stack_00000008;
  MessageBuilder local_720;
  string local_5a0 [32];
  stringstream local_580 [8];
  stringstream number_1;
  undefined1 local_570 [380];
  int local_3f4;
  string local_3f0 [4];
  GLsizei i_1;
  stringstream local_3d0 [8];
  stringstream number;
  undefined1 local_3c0 [380];
  int local_244;
  string local_240 [4];
  GLsizei i;
  Bitfield<16UL> local_220;
  stringstream local_208 [8];
  stringstream bitfield_string_stream;
  ostream local_1f8;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string the_log;
  GLuint *reference_local;
  GLuint *data_local;
  GLenum parameter_local;
  offset_in_DataTest_to_subr UploadDataFunction_local;
  DataTest *this_local;
  
  lVar1 = CONCAT44(in_register_00000014,parameter);
  the_log.field_2._8_8_ = CONCAT44(in_register_0000008c,count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"The test of ",&local_69);
  std::allocator<char>::~allocator(&local_69);
  if ((code *)UploadDataFunction == UploadUsingNamedBufferData &&
      (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_68);
  }
  else if ((code *)UploadDataFunction == UploadUsingNamedBufferSubData &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_68);
  }
  else if ((code *)UploadDataFunction == UploadUsingNamedBufferStorage &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_68);
  }
  else if ((code *)UploadDataFunction == UploadUsingCopyNamedBufferSubData &&
           (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_68);
  }
  else {
    std::__cxx11::string::append(local_68);
  }
  if ((code *)UploadDataFunction == UploadUsingNamedBufferStorage &&
      (UploadDataFunction == 0 || lVar1 == 0)) {
    std::__cxx11::string::append(local_68);
    std::__cxx11::stringstream::stringstream(local_208);
    glu::getBufferMapFlagsStr(&local_220,(int)data);
    decoder.m_begin = local_220.m_begin;
    decoder.m_value = local_220.m_value;
    decoder.m_end = local_220.m_end;
    tcu::Format::operator<<(&local_1f8,decoder);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_68);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::stringstream::~stringstream(local_208);
  }
  else {
    std::__cxx11::string::append(local_68);
    glu::getUsageName((int)data);
    std::__cxx11::string::append(local_68);
  }
  std::__cxx11::string::append(local_68);
  for (local_244 = 0; local_244 < in_stack_00000008; local_244 = local_244 + 1) {
    std::__cxx11::stringstream::stringstream(local_3d0);
    std::ostream::operator<<(local_3c0,reference[local_244]);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_68);
    std::__cxx11::string::~string(local_3f0);
    if (local_244 != in_stack_00000008 + -1) {
      std::__cxx11::string::append(local_68);
    }
    std::__cxx11::stringstream::~stringstream(local_3d0);
  }
  std::__cxx11::string::append(local_68);
  for (local_3f4 = 0; local_3f4 < in_stack_00000008; local_3f4 = local_3f4 + 1) {
    std::__cxx11::stringstream::stringstream(local_580);
    std::ostream::operator<<(local_570,*(uint *)(the_log.field_2._8_8_ + (long)local_3f4 * 4));
    std::__cxx11::stringstream::str();
    std::__cxx11::string::append((string *)local_68);
    std::__cxx11::string::~string(local_5a0);
    if (local_3f4 != in_stack_00000008 + -1) {
      std::__cxx11::string::append(local_68);
    }
    std::__cxx11::stringstream::~stringstream(local_580);
  }
  std::__cxx11::string::append(local_68);
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_720,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_720,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_720);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void DataTest::LogFail(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter,
					   const glw::GLuint* data, const glw::GLuint* reference, const glw::GLsizei count)
{
	std::string the_log = "The test of ";

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferData)
	{
		the_log.append("glNamedBufferData");
	}
	else
	{
		if (UploadDataFunction == &DataTest::UploadUsingNamedBufferSubData)
		{
			the_log.append("glNamedBufferSubData");
		}
		else
		{
			if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
			{
				the_log.append("glNamedBufferStorage");
			}
			else
			{
				if (UploadDataFunction == &DataTest::UploadUsingCopyNamedBufferSubData)
				{
					the_log.append("glCopyNamedBufferSubData");
				}
				else
				{
					the_log.append("uknown upload function");
				}
			}
		}
	}

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
	{
		the_log.append(" called with usage parameter ");

		std::stringstream bitfield_string_stream;
		bitfield_string_stream << glu::getBufferMapFlagsStr(parameter);
		the_log.append(bitfield_string_stream.str());
	}
	else
	{
		the_log.append(" called with usage parameter ");
		the_log.append(glu::getUsageName(parameter));
	}
	the_log.append(". Buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}